

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_sse2.c
# Opt level: O1

void aom_highbd_filter_block1d8_v4_sse2
               (uint16_t *src_ptr,ptrdiff_t src_pitch,uint16_t *dst_ptr,ptrdiff_t dst_pitch,
               uint32_t height,int16_t *filter,int bd)

{
  short sVar1;
  uint16_t *puVar9;
  short sVar10;
  short sVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined4 uVar16;
  undefined4 uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar36 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  undefined1 auVar24 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  
  if (1 < height) {
    auVar18 = ZEXT416((uint)~(-1 << ((byte)bd & 0x1f)));
    auVar19 = pshuflw(auVar18,auVar18,0);
    auVar18 = *(undefined1 (*) [16])(src_ptr + src_pitch * 3);
    auVar20 = *(undefined1 (*) [16])(src_ptr + src_pitch * 4);
    auVar21 = *(undefined1 (*) [16])(src_ptr + src_pitch * 2);
    auVar27._2_2_ = auVar18._8_2_;
    auVar27._0_2_ = auVar21._8_2_;
    auVar27._4_2_ = auVar21._10_2_;
    auVar27._6_2_ = auVar18._10_2_;
    auVar27._8_2_ = auVar21._12_2_;
    auVar27._10_2_ = auVar18._12_2_;
    auVar27._12_2_ = auVar21._14_2_;
    auVar27._14_2_ = auVar18._14_2_;
    auVar24._0_12_ = auVar21._0_12_;
    auVar24._12_2_ = auVar21._6_2_;
    auVar24._14_2_ = auVar18._6_2_;
    auVar44._12_4_ = auVar24._12_4_;
    auVar44._0_10_ = auVar21._0_10_;
    auVar44._10_2_ = auVar18._4_2_;
    auVar23._10_6_ = auVar44._10_6_;
    auVar23._0_8_ = auVar21._0_8_;
    auVar23._8_2_ = auVar21._4_2_;
    auVar25._8_8_ = auVar23._8_8_;
    auVar25._6_2_ = auVar18._2_2_;
    auVar25._4_2_ = auVar21._2_2_;
    auVar25._0_2_ = auVar21._0_2_;
    auVar25._2_2_ = auVar18._0_2_;
    auVar29._2_2_ = auVar20._8_2_;
    auVar29._0_2_ = auVar18._8_2_;
    auVar29._4_2_ = auVar18._10_2_;
    auVar29._6_2_ = auVar20._10_2_;
    auVar29._8_2_ = auVar18._12_2_;
    auVar29._10_2_ = auVar20._12_2_;
    auVar29._12_2_ = auVar18._14_2_;
    auVar29._14_2_ = auVar20._14_2_;
    auVar43._0_12_ = auVar18._0_12_;
    auVar43._12_2_ = auVar18._6_2_;
    auVar43._14_2_ = auVar20._6_2_;
    auVar41._12_4_ = auVar43._12_4_;
    auVar41._0_10_ = auVar18._0_10_;
    auVar41._10_2_ = auVar20._4_2_;
    auVar42._10_6_ = auVar41._10_6_;
    auVar42._0_8_ = auVar18._0_8_;
    auVar42._8_2_ = auVar18._4_2_;
    auVar21._8_8_ = auVar42._8_8_;
    auVar21._6_2_ = auVar20._2_2_;
    auVar21._4_2_ = auVar18._2_2_;
    auVar21._2_2_ = auVar20._0_2_;
    auVar21._0_2_ = auVar18._0_2_;
    uVar16 = *(undefined4 *)(filter + 2);
    uVar17 = *(undefined4 *)(filter + 4);
    auVar18._4_4_ = uVar16;
    auVar18._0_4_ = uVar16;
    auVar18._8_4_ = uVar16;
    auVar18._12_4_ = uVar16;
    do {
      auVar43 = *(undefined1 (*) [16])(src_ptr + src_pitch * 5);
      auVar35._0_12_ = auVar20._0_12_;
      auVar35._12_2_ = auVar20._6_2_;
      auVar35._14_2_ = auVar43._6_2_;
      auVar34._12_4_ = auVar35._12_4_;
      auVar34._0_10_ = auVar20._0_10_;
      auVar34._10_2_ = auVar43._4_2_;
      auVar33._10_6_ = auVar34._10_6_;
      auVar33._0_8_ = auVar20._0_8_;
      auVar33._8_2_ = auVar20._4_2_;
      auVar32._8_8_ = auVar33._8_8_;
      auVar32._6_2_ = auVar43._2_2_;
      auVar32._4_2_ = auVar20._2_2_;
      auVar32._0_2_ = auVar20._0_2_;
      auVar32._2_2_ = auVar43._0_2_;
      auVar40._2_2_ = auVar43._8_2_;
      auVar40._0_2_ = auVar20._8_2_;
      auVar40._4_2_ = auVar20._10_2_;
      auVar40._6_2_ = auVar43._10_2_;
      auVar40._8_2_ = auVar20._12_2_;
      auVar40._10_2_ = auVar43._12_2_;
      auVar40._12_2_ = auVar20._14_2_;
      auVar40._14_2_ = auVar43._14_2_;
      auVar20 = *(undefined1 (*) [16])(src_ptr + src_pitch * 6);
      auVar39._0_12_ = auVar43._0_12_;
      auVar39._12_2_ = auVar43._6_2_;
      auVar39._14_2_ = auVar20._6_2_;
      auVar38._12_4_ = auVar39._12_4_;
      auVar38._0_10_ = auVar43._0_10_;
      auVar38._10_2_ = auVar20._4_2_;
      auVar37._10_6_ = auVar38._10_6_;
      auVar37._0_8_ = auVar43._0_8_;
      auVar37._8_2_ = auVar43._4_2_;
      auVar36._8_8_ = auVar37._8_8_;
      auVar36._6_2_ = auVar20._2_2_;
      auVar36._4_2_ = auVar43._2_2_;
      auVar36._2_2_ = auVar20._0_2_;
      auVar36._0_2_ = auVar43._0_2_;
      auVar25 = pmaddwd(auVar25,auVar18);
      auVar21 = pmaddwd(auVar21,auVar18);
      auVar12._4_4_ = uVar17;
      auVar12._0_4_ = uVar17;
      auVar12._8_4_ = uVar17;
      auVar12._12_4_ = uVar17;
      auVar41 = pmaddwd(auVar32,auVar12);
      auVar13._4_4_ = uVar17;
      auVar13._0_4_ = uVar17;
      auVar13._8_4_ = uVar17;
      auVar13._12_4_ = uVar17;
      auVar42 = pmaddwd(auVar36,auVar13);
      auVar31._2_2_ = auVar20._8_2_;
      auVar31._0_2_ = auVar43._8_2_;
      auVar31._4_2_ = auVar43._10_2_;
      auVar31._6_2_ = auVar20._10_2_;
      auVar31._8_2_ = auVar43._12_2_;
      auVar31._10_2_ = auVar20._12_2_;
      auVar31._12_2_ = auVar43._14_2_;
      auVar31._14_2_ = auVar20._14_2_;
      auVar27 = pmaddwd(auVar27,auVar18);
      auVar29 = pmaddwd(auVar29,auVar18);
      auVar14._4_4_ = uVar17;
      auVar14._0_4_ = uVar17;
      auVar14._8_4_ = uVar17;
      auVar14._12_4_ = uVar17;
      auVar43 = pmaddwd(auVar40,auVar14);
      auVar15._4_4_ = uVar17;
      auVar15._0_4_ = uVar17;
      auVar15._8_4_ = uVar17;
      auVar15._12_4_ = uVar17;
      auVar44 = pmaddwd(auVar31,auVar15);
      auVar26._0_4_ = auVar25._0_4_ + 0x40 + auVar41._0_4_ >> 7;
      auVar26._4_4_ = auVar25._4_4_ + 0x40 + auVar41._4_4_ >> 7;
      auVar26._8_4_ = auVar25._8_4_ + 0x40 + auVar41._8_4_ >> 7;
      auVar26._12_4_ = auVar25._12_4_ + 0x40 + auVar41._12_4_ >> 7;
      auVar28._0_4_ = auVar27._0_4_ + 0x40 + auVar43._0_4_ >> 7;
      auVar28._4_4_ = auVar27._4_4_ + 0x40 + auVar43._4_4_ >> 7;
      auVar28._8_4_ = auVar27._8_4_ + 0x40 + auVar43._8_4_ >> 7;
      auVar28._12_4_ = auVar27._12_4_ + 0x40 + auVar43._12_4_ >> 7;
      auVar25 = packssdw(auVar26,auVar28);
      auVar22._0_4_ = auVar21._0_4_ + 0x40 + auVar42._0_4_ >> 7;
      auVar22._4_4_ = auVar21._4_4_ + 0x40 + auVar42._4_4_ >> 7;
      auVar22._8_4_ = auVar21._8_4_ + 0x40 + auVar42._8_4_ >> 7;
      auVar22._12_4_ = auVar21._12_4_ + 0x40 + auVar42._12_4_ >> 7;
      auVar30._0_4_ = auVar29._0_4_ + 0x40 + auVar44._0_4_ >> 7;
      auVar30._4_4_ = auVar29._4_4_ + 0x40 + auVar44._4_4_ >> 7;
      auVar30._8_4_ = auVar29._8_4_ + 0x40 + auVar44._8_4_ >> 7;
      auVar30._12_4_ = auVar29._12_4_ + 0x40 + auVar44._12_4_ >> 7;
      auVar21 = packssdw(auVar22,auVar30);
      sVar1 = (ushort)(-1 < auVar25._0_2_) * auVar25._0_2_;
      sVar2 = (ushort)(-1 < auVar25._2_2_) * auVar25._2_2_;
      sVar3 = (ushort)(-1 < auVar25._4_2_) * auVar25._4_2_;
      sVar4 = (ushort)(-1 < auVar25._6_2_) * auVar25._6_2_;
      sVar5 = (ushort)(-1 < auVar25._8_2_) * auVar25._8_2_;
      sVar6 = (ushort)(-1 < auVar25._10_2_) * auVar25._10_2_;
      sVar7 = (ushort)(-1 < auVar25._12_2_) * auVar25._12_2_;
      sVar8 = (ushort)(-1 < auVar25._14_2_) * auVar25._14_2_;
      sVar10 = auVar19._0_2_;
      sVar11 = auVar19._2_2_;
      *dst_ptr = (ushort)(sVar10 < sVar1) * sVar10 | (ushort)(sVar10 >= sVar1) * sVar1;
      dst_ptr[1] = (ushort)(sVar11 < sVar2) * sVar11 | (ushort)(sVar11 >= sVar2) * sVar2;
      dst_ptr[2] = (ushort)(sVar10 < sVar3) * sVar10 | (ushort)(sVar10 >= sVar3) * sVar3;
      dst_ptr[3] = (ushort)(sVar11 < sVar4) * sVar11 | (ushort)(sVar11 >= sVar4) * sVar4;
      dst_ptr[4] = (ushort)(sVar10 < sVar5) * sVar10 | (ushort)(sVar10 >= sVar5) * sVar5;
      dst_ptr[5] = (ushort)(sVar11 < sVar6) * sVar11 | (ushort)(sVar11 >= sVar6) * sVar6;
      dst_ptr[6] = (ushort)(sVar10 < sVar7) * sVar10 | (ushort)(sVar10 >= sVar7) * sVar7;
      dst_ptr[7] = (ushort)(sVar11 < sVar8) * sVar11 | (ushort)(sVar11 >= sVar8) * sVar8;
      sVar1 = (ushort)(-1 < auVar21._0_2_) * auVar21._0_2_;
      sVar2 = (ushort)(-1 < auVar21._2_2_) * auVar21._2_2_;
      sVar8 = (ushort)(-1 < auVar21._4_2_) * auVar21._4_2_;
      sVar7 = (ushort)(-1 < auVar21._6_2_) * auVar21._6_2_;
      sVar6 = (ushort)(-1 < auVar21._8_2_) * auVar21._8_2_;
      sVar5 = (ushort)(-1 < auVar21._10_2_) * auVar21._10_2_;
      sVar4 = (ushort)(-1 < auVar21._12_2_) * auVar21._12_2_;
      sVar3 = (ushort)(-1 < auVar21._14_2_) * auVar21._14_2_;
      puVar9 = dst_ptr + dst_pitch;
      *puVar9 = (ushort)(sVar10 < sVar1) * sVar10 | (ushort)(sVar10 >= sVar1) * sVar1;
      puVar9[1] = (ushort)(sVar11 < sVar2) * sVar11 | (ushort)(sVar11 >= sVar2) * sVar2;
      puVar9[2] = (ushort)(sVar10 < sVar8) * sVar10 | (ushort)(sVar10 >= sVar8) * sVar8;
      puVar9[3] = (ushort)(sVar11 < sVar7) * sVar11 | (ushort)(sVar11 >= sVar7) * sVar7;
      puVar9[4] = (ushort)(sVar10 < sVar6) * sVar10 | (ushort)(sVar10 >= sVar6) * sVar6;
      puVar9[5] = (ushort)(sVar11 < sVar5) * sVar11 | (ushort)(sVar11 >= sVar5) * sVar5;
      puVar9[6] = (ushort)(sVar10 < sVar4) * sVar10 | (ushort)(sVar10 >= sVar4) * sVar4;
      puVar9[7] = (ushort)(sVar11 < sVar3) * sVar11 | (ushort)(sVar11 >= sVar3) * sVar3;
      src_ptr = src_ptr + src_pitch * 2;
      dst_ptr = dst_ptr + dst_pitch * 2;
      height = height - 2;
      auVar21 = auVar36;
      auVar25 = auVar32;
      auVar27 = auVar40;
      auVar29 = auVar31;
    } while (1 < height);
  }
  return;
}

Assistant:

static void aom_highbd_filter_block1d8_v4_sse2(
    const uint16_t *src_ptr, ptrdiff_t src_pitch, uint16_t *dst_ptr,
    ptrdiff_t dst_pitch, uint32_t height, const int16_t *filter, int bd) {
  __m128i filtersReg;
  __m128i srcReg2, srcReg3, srcReg4, srcReg5, srcReg6;
  __m128i srcReg23_lo, srcReg23_hi, srcReg34_lo, srcReg34_hi;
  __m128i srcReg45_lo, srcReg45_hi, srcReg56_lo, srcReg56_hi;
  __m128i resReg23_lo, resReg34_lo, resReg45_lo, resReg56_lo;
  __m128i resReg23_hi, resReg34_hi, resReg45_hi, resReg56_hi;
  __m128i resReg23_45_lo, resReg34_56_lo, resReg23_45_hi, resReg34_56_hi;
  __m128i resReg23_45, resReg34_56;
  __m128i addFilterReg64, secondFilters, thirdFilters;
  unsigned int i;
  ptrdiff_t src_stride, dst_stride;

  const __m128i max = _mm_set1_epi16((1 << bd) - 1);
  addFilterReg64 = _mm_set1_epi32(64);
  filtersReg = _mm_loadu_si128((const __m128i *)filter);

  // coeffs 0 1 0 1 2 3 2 3
  const __m128i tmp0 = _mm_unpacklo_epi32(filtersReg, filtersReg);
  // coeffs 4 5 4 5 6 7 6 7
  const __m128i tmp1 = _mm_unpackhi_epi32(filtersReg, filtersReg);

  secondFilters = _mm_unpackhi_epi64(tmp0, tmp0);  // coeffs 2 3 2 3 2 3 2 3
  thirdFilters = _mm_unpacklo_epi64(tmp1, tmp1);   // coeffs 4 5 4 5 4 5 4 5

  // multiple the size of the source and destination stride by two
  src_stride = src_pitch << 1;
  dst_stride = dst_pitch << 1;

  srcReg2 = _mm_loadu_si128((const __m128i *)(src_ptr + src_pitch * 2));
  srcReg3 = _mm_loadu_si128((const __m128i *)(src_ptr + src_pitch * 3));
  srcReg23_lo = _mm_unpacklo_epi16(srcReg2, srcReg3);
  srcReg23_hi = _mm_unpackhi_epi16(srcReg2, srcReg3);

  srcReg4 = _mm_loadu_si128((const __m128i *)(src_ptr + src_pitch * 4));
  srcReg34_lo = _mm_unpacklo_epi16(srcReg3, srcReg4);
  srcReg34_hi = _mm_unpackhi_epi16(srcReg3, srcReg4);

  for (i = height; i > 1; i -= 2) {
    srcReg5 = _mm_loadu_si128((const __m128i *)(src_ptr + src_pitch * 5));

    srcReg45_lo = _mm_unpacklo_epi16(srcReg4, srcReg5);
    srcReg45_hi = _mm_unpackhi_epi16(srcReg4, srcReg5);

    srcReg6 = _mm_loadu_si128((const __m128i *)(src_ptr + src_pitch * 6));

    srcReg56_lo = _mm_unpacklo_epi16(srcReg5, srcReg6);
    srcReg56_hi = _mm_unpackhi_epi16(srcReg5, srcReg6);

    // multiply 2 adjacent elements with the filter and add the result

    resReg23_lo = _mm_madd_epi16(srcReg23_lo, secondFilters);
    resReg34_lo = _mm_madd_epi16(srcReg34_lo, secondFilters);
    resReg45_lo = _mm_madd_epi16(srcReg45_lo, thirdFilters);
    resReg56_lo = _mm_madd_epi16(srcReg56_lo, thirdFilters);

    resReg23_45_lo = _mm_add_epi32(resReg23_lo, resReg45_lo);
    resReg34_56_lo = _mm_add_epi32(resReg34_lo, resReg56_lo);

    // multiply 2 adjacent elements with the filter and add the result

    resReg23_hi = _mm_madd_epi16(srcReg23_hi, secondFilters);
    resReg34_hi = _mm_madd_epi16(srcReg34_hi, secondFilters);
    resReg45_hi = _mm_madd_epi16(srcReg45_hi, thirdFilters);
    resReg56_hi = _mm_madd_epi16(srcReg56_hi, thirdFilters);

    resReg23_45_hi = _mm_add_epi32(resReg23_hi, resReg45_hi);
    resReg34_56_hi = _mm_add_epi32(resReg34_hi, resReg56_hi);

    // shift by 7 bit each 32 bit
    resReg23_45_lo = _mm_add_epi32(resReg23_45_lo, addFilterReg64);
    resReg34_56_lo = _mm_add_epi32(resReg34_56_lo, addFilterReg64);
    resReg23_45_hi = _mm_add_epi32(resReg23_45_hi, addFilterReg64);
    resReg34_56_hi = _mm_add_epi32(resReg34_56_hi, addFilterReg64);
    resReg23_45_lo = _mm_srai_epi32(resReg23_45_lo, 7);
    resReg34_56_lo = _mm_srai_epi32(resReg34_56_lo, 7);
    resReg23_45_hi = _mm_srai_epi32(resReg23_45_hi, 7);
    resReg34_56_hi = _mm_srai_epi32(resReg34_56_hi, 7);

    // shrink to 16 bit each 32 bits, the first lane contain the first
    // convolve result and the second lane contain the second convolve
    // result
    resReg23_45 = _mm_packs_epi32(resReg23_45_lo, resReg23_45_hi);
    resReg34_56 = _mm_packs_epi32(resReg34_56_lo, resReg34_56_hi);

    resReg23_45 = _mm_max_epi16(resReg23_45, _mm_setzero_si128());
    resReg23_45 = _mm_min_epi16(resReg23_45, max);
    resReg34_56 = _mm_max_epi16(resReg34_56, _mm_setzero_si128());
    resReg34_56 = _mm_min_epi16(resReg34_56, max);

    src_ptr += src_stride;

    _mm_store_si128((__m128i *)dst_ptr, (resReg23_45));
    _mm_store_si128((__m128i *)(dst_ptr + dst_pitch), (resReg34_56));

    dst_ptr += dst_stride;

    // save part of the registers for next strides
    srcReg23_lo = srcReg45_lo;
    srcReg23_hi = srcReg45_hi;
    srcReg34_lo = srcReg56_lo;
    srcReg34_hi = srcReg56_hi;
    srcReg4 = srcReg6;
  }
}